

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  ushort *puVar1;
  uchar uVar2;
  uchar uVar3;
  short sVar4;
  uchar *puVar5;
  bool bVar6;
  int cy;
  ushort uVar7;
  uint uVar8;
  int num_vertices;
  int iVar9;
  int iVar10;
  ulong uVar11;
  stbtt_vertex *vertices;
  ushort *puVar12;
  stbtt_vertex *psVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  short sVar17;
  int was_off;
  ulong uVar18;
  int iVar19;
  long lVar20;
  byte bVar21;
  short sVar22;
  byte bVar23;
  int sx;
  int sy;
  ushort uVar24;
  stbtt_int32 cy_00;
  stbtt_int32 sVar25;
  ushort *puVar26;
  stbtt_int32 cx;
  stbtt_int32 sVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  stbtt_vertex *comp_verts;
  float local_64;
  ushort *local_60;
  ulong local_58;
  stbtt_vertex **local_50;
  float local_44;
  stbtt_fontinfo *local_40;
  ulong local_38;
  
  puVar5 = info->data;
  uVar8 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  if ((int)uVar8 < 0) {
LAB_00148384:
    iVar10 = 0;
  }
  else {
    uVar11 = (ulong)uVar8;
    uVar7 = CONCAT11(puVar5[uVar11],puVar5[uVar11 + 1]);
    local_50 = pvertices;
    if ((short)uVar7 < 1) {
      if (uVar7 == 0xffff) {
        uVar18 = 0;
        vertices = (stbtt_vertex *)0x0;
        puVar12 = (ushort *)(puVar5 + uVar11 + 10);
        local_40 = info;
        bVar21 = 1;
        do {
          bVar23 = bVar21;
          if (bVar23 == 0) break;
          comp_verts = (stbtt_vertex *)0x0;
          bVar21 = *(byte *)((long)puVar12 + 1);
          if ((bVar21 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                          ,0x586,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar21 & 1) == 0) {
            iVar16 = (int)(char)puVar12[2];
            iVar10 = (int)*(char *)((long)puVar12 + 5);
            lVar20 = 6;
          }
          else {
            iVar16 = (int)CONCAT11((char)puVar12[2],*(undefined1 *)((long)puVar12 + 5));
            iVar10 = (int)(short)(puVar12[3] << 8 | puVar12[3] >> 8);
            lVar20 = 8;
          }
          puVar26 = (ushort *)(lVar20 + (long)puVar12);
          if ((bVar21 & 8) == 0) {
            if ((bVar21 & 0x40) == 0) {
              fVar31 = 0.0;
              if ((char)bVar21 < '\0') {
                fVar30 = (float)(int)(short)(*puVar26 << 8 | *puVar26 >> 8) * 6.1035156e-05;
                puVar1 = puVar26 + 3;
                fVar33 = (float)(int)(short)(puVar26[1] << 8 | puVar26[1] >> 8) * 6.1035156e-05;
                fVar31 = (float)(int)(short)(puVar26[2] << 8 | puVar26[2] >> 8) * 6.1035156e-05;
                puVar26 = puVar26 + 4;
                fVar32 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
              }
              else {
                fVar33 = 0.0;
                fVar30 = 1.0;
                fVar32 = 1.0;
              }
            }
            else {
              puVar1 = puVar26 + 1;
              fVar30 = (float)(int)(short)(*puVar26 << 8 | *puVar26 >> 8) * 6.1035156e-05;
              puVar26 = puVar26 + 2;
              fVar31 = 0.0;
              fVar33 = 0.0;
              fVar32 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
            }
          }
          else {
            fVar30 = (float)(int)(short)(*puVar26 << 8 | *puVar26 >> 8) * 6.1035156e-05;
            puVar26 = puVar26 + 1;
            fVar31 = 0.0;
            fVar33 = 0.0;
            fVar32 = fVar30;
          }
          uVar7 = puVar12[1];
          fVar28 = fVar30 * fVar30 + fVar33 * fVar33;
          local_58 = uVar18;
          if (fVar28 < 0.0) {
            local_44 = sqrtf(fVar28);
          }
          else {
            local_44 = SQRT(fVar28);
          }
          fVar28 = fVar31 * fVar31 + fVar32 * fVar32;
          if (fVar28 < 0.0) {
            local_64 = sqrtf(fVar28);
          }
          else {
            local_64 = SQRT(fVar28);
          }
          uVar8 = stbtt_GetGlyphShape(info,(uint)(ushort)(uVar7 << 8 | uVar7 >> 8),&comp_verts);
          uVar18 = local_58;
          uVar11 = local_58;
          if ((int)uVar8 < 1) {
LAB_0014832e:
            bVar6 = true;
            uVar18 = uVar11 & 0xffffffff;
            bVar21 = bVar21 & 0x20;
          }
          else {
            local_38 = (ulong)uVar8;
            lVar20 = 0;
            do {
              fVar28 = (float)(int)*(short *)((long)&comp_verts->x + lVar20);
              fVar29 = (float)(int)*(short *)((long)&comp_verts->y + lVar20);
              *(short *)((long)&comp_verts->x + lVar20) =
                   (short)(int)((fVar30 * fVar28 + fVar31 * fVar29 + (float)iVar16) * local_44);
              *(short *)((long)&comp_verts->y + lVar20) =
                   (short)(int)((fVar28 * fVar33 + fVar29 * fVar32 + (float)iVar10) * local_64);
              fVar28 = (float)(int)*(short *)((long)&comp_verts->cx + lVar20);
              fVar29 = (float)(int)*(short *)((long)&comp_verts->cy + lVar20);
              *(short *)((long)&comp_verts->cx + lVar20) =
                   (short)(int)((fVar30 * fVar28 + fVar31 * fVar29 + (float)iVar16) * local_44);
              *(short *)((long)&comp_verts->cy + lVar20) =
                   (short)(int)((fVar28 * fVar33 + fVar29 * fVar32 + (float)iVar10) * local_64);
              lVar20 = lVar20 + 10;
            } while (local_38 * 10 != lVar20);
            iVar10 = (int)local_58;
            uVar11 = (ulong)(uVar8 + iVar10);
            local_60 = puVar26;
            psVar13 = (stbtt_vertex *)ImGui::MemAlloc(uVar11 * 10);
            if (psVar13 != (stbtt_vertex *)0x0) {
              if (0 < iVar10) {
                memcpy(psVar13,vertices,(uVar18 & 0xffffffff) * 10);
              }
              memcpy(psVar13 + (uVar18 & 0xffffffff),comp_verts,local_38 * 10);
              if (vertices != (stbtt_vertex *)0x0) {
                ImGui::MemFree(vertices);
              }
              ImGui::MemFree(comp_verts);
              vertices = psVar13;
              puVar26 = local_60;
              info = local_40;
              goto LAB_0014832e;
            }
            if (vertices != (stbtt_vertex *)0x0) {
              ImGui::MemFree(vertices);
            }
            puVar26 = local_60;
            if (comp_verts != (stbtt_vertex *)0x0) {
              ImGui::MemFree(comp_verts);
            }
            bVar6 = false;
            bVar21 = bVar23;
          }
          puVar12 = puVar26;
        } while (bVar6);
        iVar10 = (int)uVar18;
        if (bVar23 != 0) goto LAB_00148384;
      }
      else {
        if ((short)((ushort)puVar5[uVar11] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                        ,0x5bb,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        iVar10 = 0;
        vertices = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar8 = (uint)uVar7 * 2;
      uVar18 = (ulong)uVar8;
      uVar2 = puVar5[uVar18 + uVar11 + 10];
      uVar3 = puVar5[uVar18 + uVar11 + 0xb];
      bVar21 = puVar5[uVar18 + uVar11 + 8];
      bVar23 = puVar5[uVar18 + uVar11 + 9];
      uVar14 = (uint)bVar21 * 0x100 + (uint)bVar23;
      local_58 = (ulong)uVar14;
      vertices = (stbtt_vertex *)ImGui::MemAlloc((ulong)((uVar14 + (uint)uVar7 * 2) * 10 + 10));
      iVar10 = 0;
      if (vertices != (stbtt_vertex *)0x0) {
        local_60 = (ushort *)(puVar5 + uVar11 + 10);
        puVar12 = (ushort *)(puVar5 + (ulong)CONCAT11(uVar2,uVar3) + uVar18 + uVar11 + 0xc);
        uVar14 = (uint)CONCAT11(bVar21,bVar23);
        lVar20 = 0;
        bVar21 = 0;
        bVar23 = 0;
        do {
          if (bVar23 == 0) {
            bVar21 = (byte)*puVar12;
            if ((bVar21 & 8) == 0) {
              puVar12 = (ushort *)((long)puVar12 + 1);
            }
            else {
              bVar23 = *(byte *)((long)puVar12 + 1);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            bVar23 = bVar23 - 1;
          }
          (&vertices[uVar18].type)[lVar20] = bVar21;
          lVar20 = lVar20 + 10;
        } while ((ulong)(uVar14 * 2 + 2) * 5 != lVar20);
        lVar20 = 0;
        sVar22 = 0;
        do {
          bVar21 = (&vertices[uVar18].type)[lVar20];
          if ((bVar21 & 2) == 0) {
            if ((bVar21 & 0x10) == 0) {
              sVar22 = sVar22 + (*puVar12 << 8 | *puVar12 >> 8);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            uVar7 = *puVar12;
            puVar12 = (ushort *)((long)puVar12 + 1);
            uVar24 = -(ushort)(byte)uVar7;
            if ((bVar21 & 0x10) != 0) {
              uVar24 = (ushort)(byte)uVar7;
            }
            sVar22 = sVar22 + uVar24;
          }
          *(short *)((long)&vertices[uVar18].x + lVar20) = sVar22;
          lVar20 = lVar20 + 10;
        } while ((ulong)(uVar14 * 2 + 2) * 5 != lVar20);
        lVar20 = 0;
        sVar22 = 0;
        do {
          bVar21 = (&vertices[uVar18 & 0xffff].type)[lVar20];
          if ((bVar21 & 4) == 0) {
            if ((bVar21 & 0x20) == 0) {
              sVar22 = sVar22 + (*puVar12 << 8 | *puVar12 >> 8);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            uVar7 = *puVar12;
            puVar12 = (ushort *)((long)puVar12 + 1);
            uVar24 = -(ushort)(byte)uVar7;
            if ((bVar21 & 0x20) != 0) {
              uVar24 = (ushort)(byte)uVar7;
            }
            sVar22 = sVar22 + uVar24;
          }
          *(short *)((long)&vertices[uVar18 & 0xffff].y + lVar20) = sVar22;
          lVar20 = lVar20 + 10;
        } while ((ulong)(uVar14 * 2 + 2) * 5 != lVar20);
        num_vertices = 0;
        iVar10 = 0;
        iVar15 = 0;
        iVar9 = 0;
        sVar25 = 0;
        sVar27 = 0;
        sy = 0;
        sx = 0;
        uVar14 = 0;
        was_off = 0;
        iVar16 = 0;
        cy = 0;
        do {
          lVar20 = (long)(int)(uVar8 + iVar10);
          bVar21 = vertices[lVar20].type;
          sVar22 = vertices[lVar20].x;
          sVar4 = vertices[lVar20].y;
          cx = (stbtt_int32)sVar22;
          cy_00 = (stbtt_int32)sVar4;
          if (iVar9 == iVar10) {
            if (iVar10 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,was_off,uVar14,sx,sy,sVar27,
                                                sVar25,iVar16,cy);
            }
            sx = cx;
            sy = cy_00;
            if ((bVar21 & 1) == 0) {
              sVar27 = cx;
              sVar25 = cy_00;
              if ((vertices[lVar20 + 1].type & 1) == 0) {
                sx = vertices[lVar20 + 1].x + cx >> 1;
                sy = vertices[lVar20 + 1].y + cy_00 >> 1;
              }
              else {
                iVar10 = iVar10 + 1;
                sx = (int)vertices[lVar20 + 1].x;
                sy = (int)vertices[lVar20 + 1].y;
              }
            }
            uVar14 = bVar21 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)sy;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar9 = (ushort)(*(ushort *)((long)local_60 + (long)iVar15 * 2) << 8 |
                            *(ushort *)((long)local_60 + (long)iVar15 * 2) >> 8) + 1;
            iVar15 = iVar15 + 1;
            was_off = 0;
            iVar19 = iVar10;
            num_vertices = num_vertices + 1;
            cx = iVar16;
            cy_00 = cy;
          }
          else {
            sVar17 = (short)cy;
            iVar19 = iVar10;
            if ((bVar21 & 1) == 0) {
              iVar10 = num_vertices;
              if (was_off != 0) {
                iVar10 = num_vertices + 1;
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(iVar16 + cx) >> 1);
                vertices[num_vertices].y = (short)((uint)(cy + cy_00) >> 1);
                vertices[num_vertices].cx = (short)iVar16;
                vertices[num_vertices].cy = sVar17;
              }
              was_off = 1;
              num_vertices = iVar10;
            }
            else {
              psVar13 = vertices + num_vertices;
              if (was_off == 0) {
                psVar13->type = '\x02';
                psVar13->x = sVar22;
                psVar13->y = sVar4;
                psVar13->cx = 0;
                sVar17 = 0;
              }
              else {
                psVar13->type = '\x03';
                psVar13->x = sVar22;
                psVar13->y = sVar4;
                psVar13->cx = (short)iVar16;
              }
              psVar13->cy = sVar17;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx = iVar16;
              cy_00 = cy;
            }
          }
          iVar10 = iVar19 + 1;
          iVar16 = cx;
          cy = cy_00;
        } while (iVar19 < (int)local_58);
        iVar10 = stbtt__close_shape(vertices,num_vertices,was_off,uVar14,sx,sy,sVar27,sVar25,cx,
                                    cy_00);
      }
      if (vertices == (stbtt_vertex *)0x0) {
        return 0;
      }
    }
    *local_50 = vertices;
  }
  return iVar10;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}